

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

deUint32 __thiscall sglr::GLContext::createProgram(GLContext *this,ShaderProgram *shader)

{
  RenderContext *pRVar1;
  value_type pSVar2;
  bool bVar3;
  deUint32 dVar4;
  size_type sVar5;
  ShaderProgram *pSVar6;
  ProgramSources *pPVar7;
  TestError *this_00;
  ShaderSource local_248;
  ShaderSource local_220;
  ShaderSource local_1f8;
  ProgramSources local_1d0;
  undefined1 local_fd;
  ProgramSources local_f0;
  value_type local_20;
  ShaderProgram *program;
  ShaderProgram *shader_local;
  GLContext *this_local;
  
  program = (ShaderProgram *)shader;
  shader_local = (ShaderProgram *)this;
  sVar5 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::size
                    (&this->m_programs);
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::reserve
            (&this->m_programs,sVar5 + 1);
  local_20 = (value_type)0x0;
  if (((ulong)program[1].m_shaders[5].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_finish & 1) == 0) {
    pSVar6 = (ShaderProgram *)operator_new(0xd0);
    local_fd = 1;
    pRVar1 = this->m_context;
    glu::makeVtxFragSources
              (&local_f0,
               (string *)
               &program[1].m_shaders[1].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish,
               (string *)
               &program[1].m_shaders[2].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    glu::ShaderProgram::ShaderProgram(pSVar6,pRVar1,&local_f0);
    local_fd = 0;
    local_20 = pSVar6;
    glu::ProgramSources::~ProgramSources(&local_f0);
  }
  else {
    pSVar6 = (ShaderProgram *)operator_new(0xd0);
    pRVar1 = this->m_context;
    glu::ProgramSources::ProgramSources(&local_1d0);
    glu::VertexSource::VertexSource
              ((VertexSource *)&local_1f8,
               (string *)
               &program[1].m_shaders[1].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish);
    pPVar7 = glu::ProgramSources::operator<<(&local_1d0,&local_1f8);
    glu::FragmentSource::FragmentSource
              ((FragmentSource *)&local_220,
               (string *)
               &program[1].m_shaders[2].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_220);
    glu::GeometrySource::GeometrySource
              ((GeometrySource *)&local_248,(string *)(program[1].m_shaders + 4));
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_248);
    glu::ShaderProgram::ShaderProgram(pSVar6,pRVar1,pPVar7);
    local_20 = pSVar6;
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_248);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_220);
    glu::VertexSource::~VertexSource((VertexSource *)&local_1f8);
    glu::ProgramSources::~ProgramSources(&local_1d0);
  }
  bVar3 = glu::ShaderProgram::isOk(local_20);
  if (!bVar3) {
    glu::operator<<(this->m_log,local_20);
    pSVar2 = local_20;
    if (local_20 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(local_20);
      operator_delete(pSVar2,0xd0);
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrGLContext.cpp"
               ,0x364);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if ((this->m_logFlags & 2) != 0) {
    glu::operator<<(this->m_log,local_20);
  }
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::push_back
            (&this->m_programs,&local_20);
  dVar4 = glu::ShaderProgram::getProgram(local_20);
  return dVar4;
}

Assistant:

deUint32 GLContext::createProgram (ShaderProgram* shader)
{
	m_programs.reserve(m_programs.size()+1);

	glu::ShaderProgram* program = DE_NULL;

	if (!shader->m_hasGeometryShader)
		program = new glu::ShaderProgram(m_context, glu::makeVtxFragSources(shader->m_vertSrc, shader->m_fragSrc));
	else
		program = new glu::ShaderProgram(m_context,
										 glu::ProgramSources() << glu::VertexSource(shader->m_vertSrc)
															   << glu::FragmentSource(shader->m_fragSrc)
															   << glu::GeometrySource(shader->m_geomSrc));

	if (!program->isOk())
	{
		m_log << *program;
		delete program;
		TCU_FAIL("Compile failed");
	}

	if ((m_logFlags & GLCONTEXT_LOG_PROGRAMS) != 0)
		m_log << *program;

	m_programs.push_back(program);
	return program->getProgram();
}